

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsestream.h
# Opt level: O0

Vec3f __thiscall embree::ParseStream::getVec3f(ParseStream *this)

{
  char *pcVar1;
  float *in_RDI;
  float fVar2;
  double dVar3;
  undefined4 in_XMM1_Da;
  Vec3f VVar4;
  float z;
  float y;
  float x;
  string local_a8 [40];
  string local_80 [36];
  float local_5c;
  string local_58 [32];
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            ((Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  pcVar1 = (char *)std::__cxx11::string::c_str();
  dVar3 = atof(pcVar1);
  fVar2 = (float)dVar3;
  std::__cxx11::string::~string(local_58);
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            ((Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(fVar2,in_stack_ffffffffffffffc8));
  pcVar1 = (char *)std::__cxx11::string::c_str();
  dVar3 = atof(pcVar1);
  std::__cxx11::string::~string(local_80);
  local_5c = (float)dVar3;
  Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            ((Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(fVar2,in_stack_ffffffffffffffc8));
  pcVar1 = (char *)std::__cxx11::string::c_str();
  dVar3 = atof(pcVar1);
  VVar4.field_0._0_4_ = (float)dVar3;
  std::__cxx11::string::~string(local_a8);
  *in_RDI = fVar2;
  in_RDI[1] = local_5c;
  VVar4.field_0.field_0.y = 0.0;
  in_RDI[2] = VVar4.field_0._0_4_;
  VVar4.field_0.field_0.z = (float)in_XMM1_Da;
  return (Vec3f)VVar4.field_0;
}

Assistant:

Vec3f getVec3f() {
      float x = (float)atof(get().c_str());
      float y = (float)atof(get().c_str());
      float z = (float)atof(get().c_str());
      return Vec3f(x,y,z);
    }